

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_status64(int op,sqlite3_int64 *pCurrent,sqlite3_int64 *pHighwater,int resetFlag)

{
  sqlite3_mutex *psVar1;
  sqlite3StatValueType sVar2;
  int iVar3;
  Mem0Global *pMVar4;
  
  if (9 < (uint)op) {
    iVar3 = sqlite3MisuseError(0x4f95);
    return iVar3;
  }
  pMVar4 = &mem0;
  if ((0x379UL >> ((ulong)(uint)op & 0x3f) & 1) == 0) {
    pMVar4 = (Mem0Global *)&pcache1_g.mutex;
  }
  psVar1 = pMVar4->mutex;
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar1);
  }
  sVar2 = sqlite3Stat.nowValue[(uint)op];
  *pCurrent = sVar2;
  *pHighwater = sqlite3Stat.mxValue[(uint)op];
  if (resetFlag != 0) {
    sqlite3Stat.mxValue[(uint)op] = sVar2;
  }
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar1);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_status64(
  int op,
  sqlite3_int64 *pCurrent,
  sqlite3_int64 *pHighwater,
  int resetFlag
){
  sqlite3_mutex *pMutex;
  wsdStatInit;
  if( op<0 || op>=ArraySize(wsdStat.nowValue) ){
    return SQLITE_MISUSE_BKPT;
  }
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCurrent==0 || pHighwater==0 ) return SQLITE_MISUSE_BKPT;
#endif
  pMutex = statMutex[op] ? sqlite3Pcache1Mutex() : sqlite3MallocMutex();
  sqlite3_mutex_enter(pMutex);
  *pCurrent = wsdStat.nowValue[op];
  *pHighwater = wsdStat.mxValue[op];
  if( resetFlag ){
    wsdStat.mxValue[op] = wsdStat.nowValue[op];
  }
  sqlite3_mutex_leave(pMutex);
  (void)pMutex;  /* Prevent warning when SQLITE_THREADSAFE=0 */
  return SQLITE_OK;
}